

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell::
TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell
          (TEST_TeamCityOutputTest_TestGroupEscaped_End_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_00356df8;
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestGroupEscaped_End)
{
	tst->setGroupName("'[]\n\r");
	result->currentGroupStarted(tst);
	result->currentGroupEnded(tst);
	const char* expected =
		"##teamcity[testSuiteStarted name='|'|[|]|n|r']\n"
		"##teamcity[testSuiteFinished name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}